

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HydroCmd.cpp
# Opt level: O0

void clear_args(gengetopt_args_info *args_info)

{
  gengetopt_args_info *args_info_local;
  
  args_info->input_arg = (char *)0x0;
  args_info->input_orig = (char *)0x0;
  args_info->xyz_arg = (char *)0x0;
  args_info->xyz_orig = (char *)0x0;
  args_info->stl_arg = (char *)0x0;
  args_info->stl_orig = (char *)0x0;
  args_info->msms_arg = (char *)0x0;
  args_info->msms_orig = (char *)0x0;
  args_info->output_arg = (char *)0x0;
  args_info->output_orig = (char *)0x0;
  args_info->model_arg = model__NULL;
  args_info->model_orig = (char *)0x0;
  args_info->beadSize_arg = 0.2;
  args_info->beadSize_orig = (char *)0x0;
  args_info->elements_flag = 0;
  args_info->viscosity_arg = 0.01;
  args_info->viscosity_orig = (char *)0x0;
  args_info->temperature_arg = 300.0;
  args_info->temperature_orig = (char *)0x0;
  return;
}

Assistant:

static
void clear_args (struct gengetopt_args_info *args_info)
{
  FIX_UNUSED (args_info);
  args_info->input_arg = NULL;
  args_info->input_orig = NULL;
  args_info->xyz_arg = NULL;
  args_info->xyz_orig = NULL;
  args_info->stl_arg = NULL;
  args_info->stl_orig = NULL;
  args_info->msms_arg = NULL;
  args_info->msms_orig = NULL;
  args_info->output_arg = NULL;
  args_info->output_orig = NULL;
  args_info->model_arg = model__NULL;
  args_info->model_orig = NULL;
  args_info->beadSize_arg = 0.2;
  args_info->beadSize_orig = NULL;
  args_info->elements_flag = 0;
  args_info->viscosity_arg = 0.01;
  args_info->viscosity_orig = NULL;
  args_info->temperature_arg = 300;
  args_info->temperature_orig = NULL;
  
}